

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::add_blocked_sample
          (TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> *this,double t)

{
  undefined1 local_40 [8];
  Sample s;
  double t_local;
  TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> *this_local;
  
  s._32_8_ = t;
  Sample::Sample((Sample *)local_40);
  local_40 = (undefined1  [8])s._32_8_;
  s.value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 1;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<float,std::allocator<float>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,std::allocator<float>>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::vector<float,std::allocator<float>>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::vector<float,std::allocator<float>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,std::allocator<float>>>::Sample>>
              *)this,(Sample *)local_40);
  this->_dirty = true;
  Sample::~Sample((Sample *)local_40);
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }